

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolOccurrenceReplacement.cpp
# Opt level: O1

Term * __thiscall SymbolOccurrenceReplacement::process(SymbolOccurrenceReplacement *this,Term *term)

{
  uint uVar1;
  TermList TVar2;
  Term *pTVar3;
  ulong uVar4;
  Formula *formula;
  NotImplementedException *this_00;
  byte bVar5;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar6;
  ulong uVar7;
  VList *pVVar8;
  long lVar9;
  Substitution substitution;
  Stack<Kernel::TermList> local_78;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_58;
  
  uVar1 = term->_functor;
  if (uVar1 < 0xfffffff9) {
    bVar5 = uVar1 != this->_symbol | this->_isPredicate;
    uVar1 = *(uint *)&term->field_0xc & 0xfffffff;
    uVar4 = (ulong)uVar1;
    paVar6 = (anon_union_8_2_f154dc0f_for_Term_10 *)(term->_args + uVar4);
    local_78._cursor = (TermList *)0x0;
    local_78._end = (TermList *)0x0;
    local_78._capacity = 0;
    local_78._stack = (TermList *)0x0;
    local_58._timestamp = 1;
    local_58._size = 0;
    local_58._deleted = 0;
    local_58._capacityIndex = 0;
    local_58._capacity = 0;
    local_58._nextExpansionOccupancy = 0;
    local_58._entries._0_4_ = 0;
    local_58._28_8_ = 0;
    local_58._afterLast._4_4_ = 0;
    if (bVar5 == 1) {
      TVar2._content = (paVar6->_sort)._content;
      if (((uint)TVar2._content & 3) != 2) {
        paVar6 = (anon_union_8_2_f154dc0f_for_Term_10 *)(term->_args + ((ulong)uVar1 - 1));
        do {
          if (((TVar2._content & 1) == 0) && ((*(byte *)(TVar2._content + 0x28) & 0x20) == 0)) {
            TVar2 = process(this,TVar2);
            if (local_78._cursor == local_78._end) {
              ::Lib::Stack<Kernel::TermList>::expand(&local_78);
            }
          }
          else if (local_78._cursor == local_78._end) {
            ::Lib::Stack<Kernel::TermList>::expand(&local_78);
          }
          (local_78._cursor)->_content = TVar2._content;
          local_78._cursor = local_78._cursor + 1;
          TVar2._content = (paVar6->_sort)._content;
          paVar6 = paVar6 + -1;
        } while (((uint)TVar2._content & 3) != 2);
      }
    }
    else {
      pVVar8 = this->_argVars;
      if (pVVar8 != (VList *)0x0) {
        do {
          uVar1 = pVVar8->_head;
          pVVar8 = pVVar8->_tail;
          TVar2 = process(this,(paVar6->_sort)._content);
          Kernel::Substitution::bind
                    ((Substitution *)&local_58,uVar1,(sockaddr *)TVar2._content,(socklen_t)uVar4);
          paVar6 = paVar6 + -1;
        } while (pVVar8 != (List<unsigned_int> *)0x0);
      }
    }
    if (bVar5 == 0) {
      pTVar3 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                         (this->_freshApplication,(Substitution *)&local_58,false);
    }
    else {
      pTVar3 = Kernel::Term::create(term,local_78._stack);
    }
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_58);
    if (local_78._stack != (TermList *)0x0) {
      uVar4 = local_78._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_78._stack;
      }
      else if (uVar4 < 0x11) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_78._stack;
      }
      else if (uVar4 < 0x19) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_78._stack;
      }
      else if (uVar4 < 0x21) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_78._stack;
      }
      else if (uVar4 < 0x31) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_78._stack;
      }
      else if (uVar4 < 0x41) {
        (local_78._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_78._stack;
      }
      else {
        operator_delete(local_78._stack,0x10);
      }
    }
    return pTVar3;
  }
  switch(uVar1) {
  case 0xfffffff9:
    ::Lib::DArray<Kernel::TermList>::DArray
              ((DArray<Kernel::TermList> *)&local_58,(ulong)(*(uint *)&term->field_0xc & 0xfffffff))
    ;
    uVar1 = *(uint *)&term->field_0xc & 0xfffffff;
    uVar4 = (ulong)uVar1;
    if (uVar1 != 0) {
      lVar9 = 0;
      uVar7 = 0;
      do {
        TVar2 = process(this,term->_args[uVar4 + lVar9]._content);
        *(uint64_t *)(CONCAT44(local_58._nextExpansionOccupancy,local_58._capacity) + uVar7 * 8) =
             TVar2._content;
        uVar7 = uVar7 + 1;
        uVar4 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff);
        lVar9 = lVar9 + -1;
      } while (uVar7 < uVar4);
    }
    break;
  case 0xfffffffa:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x38);
    ::Lib::NotImplementedException::NotImplementedException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Shell/SymbolOccurrenceReplacement.cpp"
               ,0x36);
    __cxa_throw(this_00,&::Lib::NotImplementedException::typeinfo,::Lib::Exception::~Exception);
  case 0xfffffffb:
    if (((ulong)*(Term **)&term[-1]._maxRedLen & 3) == 0) {
      Kernel::Term::isBoolean(*(Term **)&term[-1]._maxRedLen);
    }
    process(this,(TermList)*(uint64_t *)&term[-1]._maxRedLen);
    process(this,(TermList)term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
    pTVar3 = (Term *)(*(code *)(&DAT_0093e5a4 + *(int *)(&DAT_0093e5a4 + (ulong)~term->_functor * 4)
                               ))();
    return pTVar3;
  case 0xfffffffc:
    TVar2 = process(this,*(uint64_t *)&term[-1]._functor);
    pTVar3 = Kernel::Term::createTuple((Term *)TVar2._content);
    return pTVar3;
  case 0xfffffffd:
    formula = process(this,*(Formula **)&term[-1]._functor);
    pTVar3 = Kernel::Term::createFormula(formula);
    return pTVar3;
  case 0xfffffffe:
    if (((ulong)*(Term **)&term[-1]._maxRedLen & 3) == 0) {
      Kernel::Term::isBoolean(*(Term **)&term[-1]._maxRedLen);
    }
    process(this,(TermList)*(uint64_t *)&term[-1]._maxRedLen);
    process(this,(TermList)term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
    pTVar3 = (Term *)(*(code *)(&DAT_0093e5c0 + *(int *)(&DAT_0093e5c0 + (ulong)~term->_functor * 4)
                               ))();
    return pTVar3;
  case 0xffffffff:
    process(this,*(Formula **)&term[-1]._functor);
    process(this,(TermList)term->_args[*(uint *)&term->field_0xc & 0xfffffff]._content);
    process(this,(TermList)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 1]._content)
    ;
    pTVar3 = (Term *)(*(code *)(&DAT_0093e5dc + *(int *)(&DAT_0093e5dc + (ulong)~term->_functor * 4)
                               ))();
    return pTVar3;
  }
  pTVar3 = (Term *)(*(code *)(&DAT_0093e588 + *(int *)(&DAT_0093e588 + (ulong)~term->_functor * 4)))
                             ();
  return pTVar3;
}

Assistant:

Term* SymbolOccurrenceReplacement::process(Term* term) {
  ASS(!term->isSort());

  if (term->isSpecial()) {
    Term::SpecialTermData* sd = term->getSpecialData();
    switch (term->specialFunctor()) {
      case SpecialFunctor::ITE:
        return Term::createITE(process(sd->getCondition()), process(*term->nthArgument(0)), process(*term->nthArgument(1)), sd->getSort());

      case SpecialFunctor::LET:
          if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
            // function symbols, defined inside $let are expected to be
            // disjoint and fresh symbols are expected to be fresh
            ASS_NEQ(sd->getFunctor(), _symbol);
            //ASS_NEQ(sd->getFunctor(), _freshSymbol);
          }
          return Term::createLet(sd->getFunctor(), sd->getVariables(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::FORMULA:
          return Term::createFormula(process(sd->getFormula()));

      case SpecialFunctor::LET_TUPLE:
        if (_isPredicate == (sd->getBinding().isTerm() && sd->getBinding().term()->isBoolean())) {
          // function symbols, defined inside $let are expected to be
          // disjoint and fresh symbols are expected to be fresh
          ASS_NEQ(sd->getFunctor(), _symbol);
          //ASS_NEQ(sd->getFunctor(), _freshSymbol);
        }
        return Term::createTupleLet(sd->getFunctor(), sd->getTupleSymbols(), process(sd->getBinding()), process(*term->nthArgument(0)), sd->getSort());

      case SpecialFunctor::TUPLE:
        return Term::createTuple(process(TermList(sd->getTupleTerm())).term());

      case SpecialFunctor::LAMBDA:
        NOT_IMPLEMENTED;
      case SpecialFunctor::MATCH: {
        DArray<TermList> terms(term->arity());
        for (unsigned i = 0; i < term->arity(); i++) {
          terms[i] = process(*term->nthArgument(i));
        }
        return Term::createMatch(sd->getSort(), sd->getMatchedSort(), term->arity(), terms.begin());
      }
    }
    ASSERTION_VIOLATION;
  }

  bool renaming = !_isPredicate && (term->functor() == _symbol);

  TermList* arg = term->args();
  TermStack arguments;
  Substitution substitution;

  if (renaming) {
    VList::Iterator fvit(_argVars);
    while (fvit.hasNext()) {
      unsigned var = fvit.next();
      substitution.bind(var, process(*arg));
      arg = arg->next();
    }
  } else {
    while (!arg->isEmpty()) {
      if(arg->isVar() || arg->term()->isSort()){
        arguments.push(*arg);
      } else {
        arguments.push(process(*arg));        
      }
      arg = arg->next();
    }  
  }

  if (renaming) {
    return SubstHelper::apply(_freshApplication, substitution);
  } else {
    return Term::create(term, arguments.begin());
  }
}